

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_type(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  ulong uStack_10;
  
  uVar1 = (rd->argv->field_2).it;
  if (uVar1 < 0xffff0000) {
    uStack_10 = 0xd;
  }
  else if ((uVar1 & 0xffff8000) == 0xffff0000) {
    uStack_10 = 3;
  }
  else {
    uStack_10 = (ulong)~uVar1;
  }
  TVar2 = lj_ir_kgc(J,(GCobj *)(ulong)*(uint *)((long)J->fn + uStack_10 * 8 + 0x20),IRT_STR);
  *J->base = TVar2;
  return;
}

Assistant:

static void LJ_FASTCALL recff_type(jit_State *J, RecordFFData *rd)
{
  /* Arguments already specialized. Result is a constant string. Neat, huh? */
  uint32_t t;
  if (tvisnumber(&rd->argv[0]))
    t = ~LJ_TNUMX;
  else if (LJ_64 && !LJ_GC64 && tvislightud(&rd->argv[0]))
    t = ~LJ_TLIGHTUD;
  else
    t = ~itype(&rd->argv[0]);
  J->base[0] = lj_ir_kstr(J, strV(&J->fn->c.upvalue[t]));
  UNUSED(rd);
}